

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::UpdateMergeFetch<duckdb::interval_t>
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,
               Vector *result)

{
  interval_t *result_data;
  transaction_t in_stack_00000038;
  UpdateInfo *in_stack_00000040;
  
  FlatVector::GetData<duckdb::interval_t>((Vector *)0xbbc282);
  UpdateInfo::
  UpdatesForTransaction<duckdb::UpdateMergeFetch<duckdb::interval_t>(unsigned_long,unsigned_long,duckdb::UpdateInfo&,duckdb::Vector&)::_lambda(duckdb::UpdateInfo&)_1_>
            (in_stack_00000040,in_stack_00000038,start_time,
             (anon_class_8_1_f18654ec *)transaction_id);
  return;
}

Assistant:

static void UpdateMergeFetch(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, Vector &result) {
	auto result_data = FlatVector::GetData<T>(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id,
	                                  [&](UpdateInfo &current) { MergeUpdateInfo<T>(current, result_data); });
}